

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O1

bool __thiscall
Assimp::AMFImporter::Find_ConvertedNode
          (AMFImporter *this,string *pID,list<aiNode_*,_std::allocator<aiNode_*>_> *pNodeList,
          aiNode **pNode)

{
  uint uVar1;
  aiNode *paVar2;
  int iVar3;
  _List_node_base *p_Var4;
  list<aiNode_*,_std::allocator<aiNode_*>_> *__range1;
  size_t __n;
  bool bVar5;
  bool bVar6;
  aiString node_name;
  allocator local_459;
  undefined1 *local_458;
  ulong local_450;
  undefined1 local_448 [20];
  uint local_434;
  undefined1 local_430 [1024];
  
  std::__cxx11::string::string((string *)&local_458,(pID->_M_dataplus)._M_p,&local_459);
  __n = 0x3ff;
  if ((local_450 & 0xfffffc00) == 0) {
    __n = local_450 & 0xffffffff;
  }
  local_434 = (uint)__n;
  memcpy(local_430,local_458,__n);
  local_430[__n] = 0;
  if (local_458 != local_448) {
    operator_delete(local_458);
  }
  p_Var4 = (pNodeList->super__List_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  do {
    bVar5 = p_Var4 != (_List_node_base *)pNodeList;
    if (!bVar5) {
      return bVar5;
    }
    paVar2 = (aiNode *)p_Var4[1]._M_next;
    uVar1 = (paVar2->mName).length;
    if (uVar1 == (uint)__n) {
      iVar3 = bcmp((paVar2->mName).data,local_430,(ulong)uVar1);
      bVar6 = iVar3 == 0;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      if (pNode != (aiNode **)0x0) {
        *pNode = paVar2;
      }
      if (bVar6) {
        return bVar5;
      }
    }
    p_Var4 = (((_List_base<aiNode_*,_std::allocator<aiNode_*>_> *)&p_Var4->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
  } while( true );
}

Assistant:

bool AMFImporter::Find_ConvertedNode(const std::string& pID, std::list<aiNode*>& pNodeList, aiNode** pNode) const
{
aiString node_name(pID.c_str());

	for(aiNode* node: pNodeList)
	{
		if(node->mName == node_name)
		{
			if(pNode != nullptr) *pNode = node;

			return true;
		}
	}// for(aiNode* node: pNodeList)

	return false;
}